

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_rope_f16(ggml_compute_params *params,ggml_tensor *dst,bool forward)

{
  ushort *puVar1;
  float *cache;
  float ext_factor;
  float freq_scale;
  float fVar2;
  int32_t iVar3;
  float mscale;
  int32_t iVar4;
  float fVar5;
  ushort uVar6;
  undefined2 uVar7;
  int iVar8;
  uint uVar9;
  int32_t iVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  long ne0;
  size_t sVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  undefined2 *puVar30;
  long lVar31;
  char *pcVar32;
  int iVar33;
  void *pvVar34;
  undefined8 uVar35;
  long lVar36;
  ushort *puVar37;
  undefined2 *puVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  float theta_scale;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float corr_dims [2];
  int sections [4];
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d0;
  float *local_1b8;
  long local_190;
  long local_188;
  long local_180;
  long local_160;
  long local_158;
  long local_150;
  long local_140;
  long local_130;
  long local_128;
  long local_120;
  long local_f8;
  long local_e8;
  float local_e0 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  size_t local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  size_t local_68;
  long local_60;
  long local_58;
  size_t local_50;
  undefined1 local_48 [16];
  
  ext_factor = (float)dst->op_params[7];
  freq_scale = (float)dst->op_params[6];
  pgVar11 = dst->src[1];
  fVar2 = (float)dst->op_params[5];
  pgVar12 = dst->src[0];
  pgVar13 = dst->src[2];
  iVar8 = dst->op_params[1];
  uVar42 = (ulong)iVar8;
  uVar9 = dst->op_params[2];
  iVar3 = dst->op_params[9];
  mscale = (float)dst->op_params[8];
  iVar10 = dst->op_params[4];
  local_d8 = *(undefined8 *)(dst->op_params + 0xb);
  uStack_d0 = *(undefined8 *)(dst->op_params + 0xd);
  iVar4 = dst->op_params[10];
  if (dst->nb[0] == 2) {
    sVar14 = pgVar12->nb[1];
    sVar15 = pgVar12->nb[2];
    sVar16 = pgVar12->nb[0];
    ne0 = dst->ne[0];
    iVar28 = params->ith;
    iVar25 = params->nth;
    sVar17 = pgVar12->nb[3];
    lVar18 = dst->ne[1];
    lVar19 = dst->ne[2];
    lVar20 = dst->ne[3];
    local_50 = dst->nb[1];
    local_68 = dst->nb[2];
    local_c0 = dst->nb[3];
    iVar24 = ggml_nrows(dst);
    if (ne0 < (long)uVar42) {
      pcVar32 = "n_dims <= ne0";
      uVar35 = 0x14c0;
    }
    else if ((uVar42 & 1) == 0) {
      iVar25 = (iVar25 + -1 + iVar24) / iVar25;
      iVar33 = iVar25 * iVar28;
      iVar25 = iVar25 + iVar33;
      if (iVar24 <= iVar25) {
        iVar25 = iVar24;
      }
      theta_scale = powf(fVar2,-2.0 / (float)iVar8);
      ggml_rope_yarn_corr_dims(fVar2,iVar3,iVar4,iVar8,iVar10,local_e0);
      if (((((uVar9 & 8) == 0) || (0 < (int)local_d8)) || (0 < local_d8._4_4_)) ||
         (0 < (int)uStack_d0)) {
        if ((uVar9 == 0x18) && (ne0 / 2 != uVar42)) {
          pcVar32 = "n_dims == ne0/2";
          uVar35 = 0x14db;
        }
        else {
          if (pgVar13 == (ggml_tensor *)0x0) {
            local_1b8 = (float *)0x0;
LAB_0013e990:
            if (0 < lVar20) {
              local_120 = uVar42 * 2 + 2;
              local_90 = uVar42 * 2;
              local_150 = 0;
              local_190 = 0;
              iVar24 = 0;
              local_1d0 = 0;
              local_78 = (ne0 + 0x10) * (long)iVar28;
              local_130 = 2;
              pvVar34 = pgVar11->data;
              local_48 = ZEXT416((uint)forward * 0x3f800000 + (uint)!forward * -0x40800000);
              local_88 = lVar19 * 0xc;
              local_80 = local_78 * 4 + 4;
              local_188 = (long)(iVar8 >> 1) * 2;
              local_a8 = uVar42 * 3;
              local_128 = sVar16 * uVar42 + 2;
              local_180 = local_90;
              local_70 = pvVar34;
              do {
                local_b8 = local_130;
                local_b0 = local_150;
                local_a0 = local_120;
                local_98 = local_128;
                if (0 < lVar19) {
                  local_60 = local_1d0 * sVar17;
                  local_140 = local_180;
                  lVar31 = 0;
                  local_158 = local_188;
                  local_160 = local_190;
                  do {
                    pvVar21 = params->wdata;
                    cache = (float *)((long)pvVar21 + local_78 * 4);
                    iVar28 = *(int *)((long)pvVar34 + lVar31 * 4);
                    if ((uVar9 & 8) == 0) {
                      ggml_rope_cache_init
                                ((float)iVar28,freq_scale,local_1b8,local_e0,ne0,ext_factor,mscale,
                                 cache,local_48._0_4_,theta_scale);
                    }
                    else {
                      ggml_mrope_cache_init
                                ((float)iVar28,
                                 (float)*(int *)((long)pvVar34 + lVar19 * 4 + lVar31 * 4),
                                 (float)*(int *)((long)pvVar34 + lVar19 * 8 + lVar31 * 4),
                                 (float)*(int *)((long)pvVar34 + local_88 + lVar31 * 4),
                                 (int *)&local_d8,uVar9 == 0x18,freq_scale,local_1b8,local_e0,ne0,
                                 ext_factor,mscale,cache,local_48._0_4_,theta_scale);
                    }
                    if (0 < lVar18) {
                      local_1e8 = local_128;
                      local_58 = lVar31 * sVar15;
                      local_1e0 = local_120;
                      local_1f0 = local_130;
                      iVar26 = (int)lVar18 + iVar24;
                      local_e8 = local_140;
                      local_f8 = local_158;
                      lVar36 = 0;
                      lVar27 = local_150;
                      lVar41 = local_160;
                      iVar28 = iVar24;
                      do {
                        if (iVar33 <= iVar28) {
                          iVar24 = iVar28 + 1;
                          if (iVar25 <= iVar28) break;
                          if ((uVar9 & 10) == 0) {
                            if (0 < iVar8) {
                              puVar37 = (ushort *)((long)pgVar12->data + local_1f0);
                              pvVar34 = dst->data;
                              lVar29 = 0;
                              do {
                                puVar1 = puVar37 + -1;
                                fVar2 = *(float *)((long)pvVar21 + lVar29 * 4 + local_80);
                                fVar5 = *(float *)((long)pvVar21 + lVar29 * 4 + local_80 + -4);
                                uVar6 = *puVar37;
                                puVar37 = puVar37 + sVar16;
                                auVar44 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)uVar6 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*puVar1 * 4)),
                                                  ZEXT416((uint)fVar5));
                                auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)uVar6 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*puVar1 * 4)),
                                                  ZEXT416((uint)fVar2));
                                auVar44 = vcvtps2ph_f16c(auVar44,0);
                                auVar43 = vcvtps2ph_f16c(auVar43,0);
                                auVar43 = vpunpcklwd_avx(auVar44,auVar43);
                                *(int *)((long)pvVar34 + lVar29 * 2 + lVar27) = auVar43._0_4_;
                                lVar29 = lVar29 + 2;
                              } while (lVar29 < (long)uVar42);
                            }
LAB_0013ef57:
                            if (uVar9 != 0x18) {
LAB_0013f028:
                              if ((long)uVar42 < ne0) {
                                puVar38 = (undefined2 *)((long)dst->data + local_1e0);
                                puVar30 = (undefined2 *)((long)pgVar12->data + local_1e8);
                                uVar39 = uVar42;
                                do {
                                  uVar39 = uVar39 + 2;
                                  puVar38[-1] = puVar30[-1];
                                  uVar7 = *puVar30;
                                  puVar30 = puVar30 + sVar16;
                                  *puVar38 = uVar7;
                                  puVar38 = puVar38 + 2;
                                } while ((long)uVar39 < ne0);
                              }
                              goto LAB_0013ed1c;
                            }
                          }
                          else {
                            if (uVar9 != 0x18) {
                              if (0 < iVar8) {
                                lVar40 = 0;
                                lVar29 = 0;
                                do {
                                  lVar22 = lVar40 + lVar41;
                                  fVar2 = *(float *)((long)pvVar21 + lVar29 * 4 + local_80);
                                  fVar5 = *(float *)((long)pvVar21 + lVar29 * 4 + local_80 + -4);
                                  lVar23 = lVar40 + local_f8;
                                  lVar40 = lVar40 + sVar16;
                                  auVar44 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)((long)pgVar12->data + lVar23) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar12->data
                                                                                + lVar22) * 4)),
                                                  ZEXT416((uint)fVar5));
                                  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)((long)pgVar12->data + lVar23) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar12->data
                                                                                + lVar22) * 4)),
                                                  ZEXT416((uint)fVar2));
                                  auVar44 = vcvtps2ph_f16c(auVar44,0);
                                  auVar43 = vcvtps2ph_f16c(auVar43,0);
                                  vpextrw_avx(auVar44,0);
                                  vpextrw_avx(auVar43,0);
                                  lVar29 = lVar29 + 2;
                                } while (lVar29 < (long)uVar42);
                                goto LAB_0013ef57;
                              }
                              goto LAB_0013f028;
                            }
                            if (0 < iVar8) {
                              lVar40 = 0;
                              lVar29 = 0;
                              do {
                                lVar22 = lVar40 + lVar41;
                                fVar2 = *(float *)((long)pvVar21 + lVar29 * 4 + local_80);
                                fVar5 = *(float *)((long)pvVar21 + lVar29 * 4 + local_80 + -4);
                                lVar23 = lVar40 + local_e8;
                                lVar40 = lVar40 + sVar16;
                                auVar44 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)((long)pgVar12->data + lVar23) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar12->data
                                                                                + lVar22) * 4)),
                                                  ZEXT416((uint)fVar5));
                                auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)((long)pgVar12->data + lVar23) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar12->data
                                                                                + lVar22) * 4)),
                                                  ZEXT416((uint)fVar2));
                                auVar44 = vcvtps2ph_f16c(auVar44,0);
                                auVar43 = vcvtps2ph_f16c(auVar43,0);
                                vpextrw_avx(auVar44,0);
                                vpextrw_avx(auVar43,0);
                                lVar29 = lVar29 + 2;
                              } while (lVar29 < (long)uVar42);
                              goto LAB_0013ef57;
                            }
                          }
                          if ((long)uVar42 < ne0) {
                            lVar29 = lVar36 * sVar14 + local_58 + local_60;
                            uVar39 = uVar42;
                            do {
                              lVar40 = ((long)uVar39 >> 1) * sVar16;
                              fVar2 = *(float *)((long)pvVar21 + uVar39 * 4 + local_80);
                              fVar5 = *(float *)((long)pvVar21 + uVar39 * 4 + local_80 + -4);
                              uVar39 = uVar39 + 2;
                              auVar44 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar12->data +
                                                          uVar42 * 2 + lVar40 + lVar29) * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar12->data +
                                                                           lVar40 + lVar29) * 4)),
                                                  ZEXT416((uint)fVar5));
                              auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar12->data +
                                                          uVar42 * 2 + lVar40 + lVar29) * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar12->data +
                                                                           lVar40 + lVar29) * 4)),
                                                  ZEXT416((uint)fVar2));
                              auVar44 = vcvtps2ph_f16c(auVar44,0);
                              auVar43 = vcvtps2ph_f16c(auVar43,0);
                              vpextrw_avx(auVar44,0);
                              vpextrw_avx(auVar43,0);
                            } while ((long)uVar39 < ne0);
                          }
                        }
LAB_0013ed1c:
                        lVar36 = lVar36 + 1;
                        lVar41 = lVar41 + sVar14;
                        local_f8 = local_f8 + sVar14;
                        local_e8 = local_e8 + sVar14;
                        local_1f0 = local_1f0 + sVar14;
                        local_1e8 = local_1e8 + sVar14;
                        local_1e0 = local_1e0 + local_50;
                        lVar27 = lVar27 + local_50;
                        iVar28 = iVar28 + 1;
                        iVar24 = iVar26;
                      } while (lVar36 != lVar18);
                    }
                    local_160 = local_160 + sVar15;
                    local_158 = local_158 + sVar15;
                    local_140 = local_140 + sVar15;
                    local_130 = local_130 + sVar15;
                    local_128 = local_128 + sVar15;
                    local_150 = local_150 + local_68;
                    local_120 = local_120 + local_68;
                    lVar31 = lVar31 + 1;
                    pvVar34 = local_70;
                  } while (lVar31 != lVar19);
                }
                local_128 = local_98 + sVar17;
                local_190 = local_190 + sVar17;
                local_188 = local_188 + sVar17;
                local_180 = local_180 + sVar17;
                local_130 = local_b8 + sVar17;
                local_1d0 = local_1d0 + 1;
                local_150 = local_b0 + local_c0;
                local_90 = local_90 + local_c0;
                local_a8 = local_a8 + local_c0;
                local_120 = local_a0 + local_c0;
              } while (local_1d0 != lVar20);
            }
            return;
          }
          if (pgVar13->type == GGML_TYPE_F32) {
            if ((long)(iVar8 >> 1) <= pgVar13->ne[0]) {
              local_1b8 = (float *)pgVar13->data;
              goto LAB_0013e990;
            }
            pcVar32 = "src2->ne[0] >= n_dims / 2";
            uVar35 = 0x14e1;
          }
          else {
            pcVar32 = "src2->type == GGML_TYPE_F32";
            uVar35 = 0x14e0;
          }
        }
      }
      else {
        pcVar32 = "sections[0] > 0 || sections[1] > 0 || sections[2] > 0";
        uVar35 = 0x14d7;
      }
    }
    else {
      pcVar32 = "n_dims % 2 == 0";
      uVar35 = 0x14c1;
    }
  }
  else {
    pcVar32 = "nb0 == sizeof(ggml_fp16_t)";
    uVar35 = 0x14b9;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar35,"GGML_ASSERT(%s) failed",pcVar32);
}

Assistant:

static void ggml_compute_forward_rope_f16(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const bool forward) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    float freq_base, freq_scale, ext_factor, attn_factor, beta_fast, beta_slow;
    int sections[4];

    //const int n_past     = ((int32_t *) dst->op_params)[0];
    const int n_dims     = ((int32_t *) dst->op_params)[1];
    const int mode       = ((int32_t *) dst->op_params)[2];
    //const int n_ctx      = ((int32_t *) dst->op_params)[3];
    const int n_ctx_orig = ((int32_t *) dst->op_params)[4];
    memcpy(&freq_base,   (int32_t *) dst->op_params +  5, sizeof(float));
    memcpy(&freq_scale,  (int32_t *) dst->op_params +  6, sizeof(float));
    memcpy(&ext_factor,  (int32_t *) dst->op_params +  7, sizeof(float));
    memcpy(&attn_factor, (int32_t *) dst->op_params +  8, sizeof(float));
    memcpy(&beta_fast,   (int32_t *) dst->op_params +  9, sizeof(float));
    memcpy(&beta_slow,   (int32_t *) dst->op_params + 10, sizeof(float));
    memcpy(&sections,    (int32_t *) dst->op_params + 11, sizeof(int)*4);


    GGML_TENSOR_UNARY_OP_LOCALS

    //printf("ne0: %d, ne1: %d, ne2: %d, ne3: %d\n", ne0, ne1, ne2, ne3);
    //printf("n_past = %d, ne2 = %d\n", n_past, ne2);

    GGML_ASSERT(nb0 == sizeof(ggml_fp16_t));

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr = ggml_nrows(dst);

    GGML_ASSERT(n_dims <= ne0);
    GGML_ASSERT(n_dims % 2 == 0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    // row index used to determine which thread to use
    int ir = 0;

    const float theta_scale = powf(freq_base, -2.0f/n_dims);

    float corr_dims[2];
    ggml_rope_yarn_corr_dims(n_dims, n_ctx_orig, freq_base, beta_fast, beta_slow, corr_dims);

    const bool is_neox = mode & GGML_ROPE_TYPE_NEOX;
    const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;
    const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

    if (is_mrope) {
        GGML_ASSERT(sections[0] > 0 || sections[1] > 0 || sections[2] > 0);
    }

    if (is_vision) {
        GGML_ASSERT(n_dims == ne0/2);
    }

    const float * freq_factors = NULL;
    if (src2 != NULL) {
        GGML_ASSERT(src2->type == GGML_TYPE_F32);
        GGML_ASSERT(src2->ne[0] >= n_dims / 2);
        freq_factors = (const float *) src2->data;
    }

    // backward process uses inverse rotation by cos and sin.
    // cos and sin build a rotation matrix, where the inverse is the transpose.
    // this essentially just switches the sign of sin.
    const float sin_sign = forward ? 1.0f : -1.0f;

    const int32_t * pos = (const int32_t *) src1->data;

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {

            float * cache = (float *) params->wdata + (ne0 + CACHE_LINE_SIZE_F32)*ith;
            if (!is_mrope) {
                const int64_t p = pos[i2];
                ggml_rope_cache_init(p, freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }
            else {
                const int64_t p_t = pos[i2];
                const int64_t p_h = pos[i2 + ne2];
                const int64_t p_w = pos[i2 + ne2 * 2];
                const int64_t p_e = pos[i2 + ne2 * 3];
                ggml_mrope_cache_init(
                    p_t, p_h, p_w, p_e, sections, is_vision,
                    freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }

            for (int64_t i1 = 0; i1 < ne1; i1++) {
                if (ir++ < ir0) continue;
                if (ir   > ir1) break;

                if (is_neox || is_mrope) {
                    if (is_vision) {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                            dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    } else {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims/2]);

                            dst_data[0]        = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims/2] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    }
                } else {
                    for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                              ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[1]);

                        dst_data[0] = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[1] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                }

                if (is_vision) {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const int64_t ic = i0/2;

                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                        dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                } else {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        dst_data[0] = src[0];
                        dst_data[1] = src[1];
                    }
                }
            }
        }
    }
}